

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Srm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pInit;
  char *pcVar3;
  char *local_88;
  uint local_70;
  uint local_6c;
  int fDualOut;
  int fSkipSome;
  int fSpeculate;
  int fSynthesis;
  int fVerbose;
  int c;
  Gia_Man_t *pAux;
  Gia_Man_t *pTemp;
  char pFileName2 [10];
  char pFileName [10];
  char *pFileNameIn;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pFileName[2] = '\0';
  pFileName[3] = '\0';
  pFileName[4] = '\0';
  pFileName[5] = '\0';
  pFileName[6] = '\0';
  pFileName[7] = '\0';
  pFileName[8] = '\0';
  pFileName[9] = '\0';
  builtin_strncpy(pFileName2 + 2,"gsrm.aig",8);
  stack0xffffffffffffffbc = 0x6769612e6e797367;
  pFileName2[0] = '\0';
  pFileName2[1] = '\0';
  fSpeculate = 0;
  fSkipSome = 0;
  fDualOut = 1;
  local_6c = 0;
  local_70 = 0;
  Extra_UtilGetoptReset();
LAB_00251f74:
  iVar1 = Extra_UtilGetopt(argc,argv,"Adrsfvh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Srm(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pcVar3 = "s";
      if (fDualOut != 0) {
        pcVar3 = "";
      }
      sprintf(pFileName2 + 2,"gsrm%s.aig",pcVar3);
      pcVar3 = "s";
      if (fDualOut != 0) {
        pcVar3 = "";
      }
      sprintf((char *)((long)&pTemp + 4),"gsyn%s.aig",pcVar3);
      pGVar2 = Gia_ManSpecReduce(pAbc->pGia,local_70,fSkipSome,fDualOut,local_6c,fSpeculate);
      if (pGVar2 != (Gia_Man_t *)0x0) {
        pAux = pGVar2;
        if (fDualOut != 0) {
          pAux = Gia_ManSeqStructSweep(pGVar2,1,1,0);
          Gia_ManStop(pGVar2);
        }
        if (pFileName._2_8_ == 0) {
          local_88 = pFileName2 + 2;
        }
        else {
          local_88 = (char *)pFileName._2_8_;
        }
        Gia_AigerWrite(pAux,local_88,0,0);
        Abc_Print(1,"Speculatively reduced model was written into file \"%s\".\n",pFileName2 + 2);
        Gia_ManPrintStatsShort(pAux);
        Gia_ManStop(pAux);
      }
      if ((fSkipSome != 0) &&
         (pGVar2 = Gia_ManEquivReduce(pAbc->pGia,1,local_70,0,fSpeculate),
         pGVar2 != (Gia_Man_t *)0x0)) {
        pInit = Gia_ManSeqStructSweep(pGVar2,1,1,0);
        Gia_ManStop(pGVar2);
        Gia_AigerWrite(pInit,(char *)((long)&pTemp + 4),0,0);
        Abc_Print(1,"Reduced original network was written into file \"%s\".\n",(long)&pTemp + 4);
        Gia_ManPrintStatsShort(pInit);
        Gia_ManStop(pInit);
      }
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x41:
    if (globalUtilOptind < argc) {
      pFileName._2_8_ = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00251f74;
    }
    Abc_Print(-1,"Command line switch \"-A\" should be followed by a file name.\n");
    break;
  default:
    break;
  case 100:
    local_70 = local_70 ^ 1;
    goto LAB_00251f74;
  case 0x66:
    local_6c = local_6c ^ 1;
    goto LAB_00251f74;
  case 0x68:
    break;
  case 0x72:
    fSkipSome = fSkipSome ^ 1;
    goto LAB_00251f74;
  case 0x73:
    fDualOut = fDualOut ^ 1;
    goto LAB_00251f74;
  case 0x76:
    goto switchD_00251fba_caseD_76;
  }
  Abc_Print(-2,"usage: &srm [-A file] [-drsfvh]\n");
  Abc_Print(-2,"\t          writes speculatively reduced model into file \"%s\"\n",pFileName2 + 2);
  Abc_Print(-2,
            "\t-A file : file name for dumping speculative-reduced model [default = \"gsrm.aig\"]\n"
           );
  pcVar3 = "no";
  if (local_70 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-d      : toggle creating dual-output miter [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fSkipSome != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-r      : toggle writing reduced network for synthesis [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fDualOut != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-s      : toggle using speculation at the internal nodes [default = %s]\n",pcVar3)
  ;
  pcVar3 = "no";
  if (local_6c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-f      : toggle filtering to remove redundant equivalences [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fSpeculate != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  return 1;
switchD_00251fba_caseD_76:
  fSpeculate = fSpeculate ^ 1;
  goto LAB_00251f74;
}

Assistant:

int Abc_CommandAbc9Srm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileNameIn = NULL;
    char pFileName[10] = "gsrm.aig", pFileName2[10] = "gsyn.aig";
    Gia_Man_t * pTemp, * pAux;
    int c, fVerbose = 0;
    int fSynthesis = 0;
    int fSpeculate = 1;
    int fSkipSome = 0;
    int fDualOut = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Adrsfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileNameIn = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'r':
            fSynthesis ^= 1;
            break;
        case 's':
            fSpeculate ^= 1;
            break;
        case 'f':
            fSkipSome ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm(): There is no AIG.\n" );
        return 1;
    }
    sprintf(pFileName,  "gsrm%s.aig", fSpeculate? "" : "s" );
    sprintf(pFileName2, "gsyn%s.aig", fSpeculate? "" : "s" );
    pTemp = Gia_ManSpecReduce( pAbc->pGia, fDualOut, fSynthesis, fSpeculate, fSkipSome, fVerbose );
    if ( pTemp )
    {
        if ( fSpeculate )
        {
            pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
            Gia_ManStop( pAux );
        }
        Gia_AigerWrite( pTemp, pFileNameIn ? pFileNameIn : pFileName, 0, 0 );
        Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", pFileName );
        Gia_ManPrintStatsShort( pTemp );
        Gia_ManStop( pTemp );
    }
    if ( fSynthesis )
    {
        pTemp = Gia_ManEquivReduce( pAbc->pGia, 1, fDualOut, 0, fVerbose );
        if ( pTemp )
        {
            pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
            Gia_ManStop( pAux );

            Gia_AigerWrite( pTemp, pFileName2, 0, 0 );
            Abc_Print( 1, "Reduced original network was written into file \"%s\".\n", pFileName2 );
            Gia_ManPrintStatsShort( pTemp );
            Gia_ManStop( pTemp );
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &srm [-A file] [-drsfvh]\n" );
    Abc_Print( -2, "\t          writes speculatively reduced model into file \"%s\"\n", pFileName );
    Abc_Print( -2, "\t-A file : file name for dumping speculative-reduced model [default = \"gsrm.aig\"]\n" );
    Abc_Print( -2, "\t-d      : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle writing reduced network for synthesis [default = %s]\n", fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using speculation at the internal nodes [default = %s]\n", fSpeculate? "yes": "no" );
    Abc_Print( -2, "\t-f      : toggle filtering to remove redundant equivalences [default = %s]\n", fSkipSome? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}